

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void __thiscall
trompeloeil::list<trompeloeil::side_effect_base<void_()>,_trompeloeil::delete_disposer>::~list
          (list<trompeloeil::side_effect_base<void_()>,_trompeloeil::delete_disposer> *this)

{
  list_elem<trompeloeil::side_effect_base<void_()>_> *plVar1;
  list_elem<trompeloeil::side_effect_base<void_()>_> *plVar2;
  
  (this->super_list_elem<trompeloeil::side_effect_base<void_()>_>)._vptr_list_elem =
       (_func_int **)&PTR__list_0017fff8;
  plVar2 = (this->super_list_elem<trompeloeil::side_effect_base<void_()>_>).next;
  while (plVar2 != &this->super_list_elem<trompeloeil::side_effect_base<void_()>_>) {
    plVar1 = (list_elem<trompeloeil::side_effect_base<void_()>_> *)&plVar2->_vptr_list_elem;
    plVar2 = plVar2->next;
    (*plVar1->_vptr_list_elem[1])();
  }
  list_elem<trompeloeil::side_effect_base<void_()>_>::~list_elem
            (&this->super_list_elem<trompeloeil::side_effect_base<void_()>_>);
  return;
}

Assistant:

list<T, Disposer>::~list()
  {
    auto i = this->begin();
    while (i != this->end())
    {
      auto p = i++;
      Disposer::dispose(&*p);
    }
  }